

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lrq.cc
# Opt level: O2

void predict_or_learn<false>(LRQstate *lrq,single_learner *base,example *ec)

{
  _Rb_tree_header *p_Var1;
  features *this;
  float fVar2;
  byte bVar3;
  byte bVar4;
  uint32_t uVar5;
  vw *pvVar6;
  byte *pbVar7;
  uint64_t uVar8;
  unsigned_long uVar9;
  bool bVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  byte *pbVar14;
  features *pfVar15;
  v_array<std::shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_00;
  ulong uVar16;
  weight *pwVar17;
  ostream *poVar18;
  char *pcVar19;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_01;
  _Rb_tree_node_base *p_Var20;
  uint32_t *puVar21;
  long lVar22;
  uint uVar23;
  ulong uVar24;
  size_t sVar25;
  size_t *__s;
  ulong uVar26;
  float fVar27;
  char *new_feature;
  char *new_space;
  char *local_1d8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1d0 [3];
  stringstream new_feature_buffer;
  ostream local_1a8;
  
  pvVar6 = lrq->all;
  __s = lrq->orig_size;
  memset(__s,0,0x800);
  pbVar7 = (ec->super_example_predict).indices._end;
  for (pbVar14 = (ec->super_example_predict).indices._begin; pbVar14 != pbVar7;
      pbVar14 = pbVar14 + 1) {
    bVar3 = *pbVar14;
    if (lrq->lrindices[bVar3] == true) {
      __s[bVar3] = (long)(ec->super_example_predict).feature_space[bVar3].values._end -
                   (long)(ec->super_example_predict).feature_space[bVar3].values._begin >> 2;
    }
  }
  if (lrq->dropout == false) {
    fVar27 = 1.0;
  }
  else {
    fVar27 = 0.5;
  }
  sVar25 = ec->example_counter;
  p_Var1 = &(lrq->lrpairs)._M_t._M_impl.super__Rb_tree_header;
  puVar21 = &(pvVar6->weights).dense_weights._stride_shift;
  if ((pvVar6->weights).sparse != false) {
    puVar21 = &(pvVar6->weights).sparse_weights._stride_shift;
  }
  uVar5 = *puVar21;
  bVar10 = true;
  while (bVar10) {
    uVar24 = (ulong)((uint)sVar25 & 1);
    uVar26 = uVar24 ^ 1;
    for (p_Var20 = (lrq->lrpairs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var20 != p_Var1;
        p_Var20 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var20)) {
      lVar22 = *(long *)(p_Var20 + 1);
      bVar3 = *(byte *)(lVar22 + uVar24);
      bVar4 = *(byte *)(lVar22 + uVar26);
      uVar11 = atoi((char *)(lVar22 + 2));
      pfVar15 = (ec->super_example_predict).feature_space + bVar3;
      this = (ec->super_example_predict).feature_space + bVar4;
      this_00 = &(ec->super_example_predict).feature_space[bVar4].space_names;
      uVar13 = 0;
      while( true ) {
        uVar16 = (ulong)uVar13;
        if (__s[bVar3] <= uVar16) break;
        fVar2 = (pfVar15->values)._begin[uVar16];
        uVar8 = (ec->super_example_predict).ft_offset;
        uVar9 = (pfVar15->indicies)._begin[uVar16];
        for (uVar12 = 1; uVar12 <= uVar11; uVar12 = uVar12 + 1) {
          lVar22 = (ulong)uVar12 << ((byte)uVar5 & 0x3f);
          pwVar17 = parameters::operator[](&lrq->all->weights,uVar8 + uVar9 + lVar22);
          for (uVar23 = 0; uVar16 = (ulong)uVar23, uVar16 < __s[bVar4]; uVar23 = uVar23 + 1) {
            features::push_back(this,*pwVar17 * fVar27 * fVar2 * (this->values)._begin[uVar16],
                                (this->indicies)._begin[uVar16] + lVar22);
            if ((pvVar6->audit != false) || (pvVar6->hash_inv == true)) {
              std::__cxx11::stringstream::stringstream((stringstream *)&new_feature_buffer);
              poVar18 = std::operator<<(&local_1a8,bVar4);
              poVar18 = std::operator<<(poVar18,'^');
              poVar18 = std::operator<<(poVar18,(string *)
                                                &(this_00->_begin[uVar16].
                                                  super___shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                                                 ._M_ptr)->second);
              poVar18 = std::operator<<(poVar18,'^');
              std::ostream::_M_insert<unsigned_long>((ulong)poVar18);
              new_space = strdup("lrq");
              std::__cxx11::stringbuf::str();
              pcVar19 = strdup(local_1d8);
              std::__cxx11::string::~string((string *)&local_1d8);
              new_feature = pcVar19;
              this_01 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)operator_new(0x40);
              std::
              pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::pair<char_*&,_char_*&,_true>(this_01,&new_space,&new_feature);
              std::
              __shared_ptr<std::pair<std::__cxx11::string,std::__cxx11::string>,(__gnu_cxx::_Lock_policy)2>
              ::__shared_ptr<std::pair<std::__cxx11::string,std::__cxx11::string>,void>
                        ((__shared_ptr<std::pair<std::__cxx11::string,std::__cxx11::string>,(__gnu_cxx::_Lock_policy)2>
                          *)&local_1d8,this_01);
              v_array<std::shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::push_back(this_00,(shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)&local_1d8);
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_1d0);
              std::__cxx11::stringstream::~stringstream((stringstream *)&new_feature_buffer);
            }
          }
        }
        uVar13 = uVar13 + 1;
      }
    }
    LEARNER::learner<char,_example>::predict(base,ec,0);
    for (p_Var20 = (lrq->lrpairs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var20 != p_Var1;
        p_Var20 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var20)) {
      bVar3 = *(byte *)(*(long *)(p_Var20 + 1) + uVar26);
      features::truncate_to((ec->super_example_predict).feature_space + bVar3,__s[bVar3]);
    }
    sVar25 = sVar25 + 1;
    bVar10 = false;
  }
  return;
}

Assistant:

void predict_or_learn(LRQstate& lrq, single_learner& base, example& ec)
{
  vw& all = *lrq.all;

  // Remember original features

  memset(lrq.orig_size, 0, sizeof(lrq.orig_size));
  for (namespace_index i : ec.indices)
  {
    if (lrq.lrindices[i])
      lrq.orig_size[i] = ec.feature_space[i].size();
  }

  size_t which = ec.example_counter;
  float first_prediction = 0;
  float first_loss = 0;
  float first_uncertainty = 0;
  unsigned int maxiter = (is_learn && !example_is_test(ec)) ? 2 : 1;

  bool do_dropout = lrq.dropout && is_learn && !example_is_test(ec);
  float scale = (!lrq.dropout || do_dropout) ? 1.f : 0.5f;

  uint32_t stride_shift = lrq.all->weights.stride_shift();
  for (unsigned int iter = 0; iter < maxiter; ++iter, ++which)
  {
    // Add left LRQ features, holding right LRQ features fixed
    //     and vice versa
    // TODO: what happens with --lrq ab2 --lrq ac2
    //       i.e. namespace occurs multiple times (?)

    for (string const& i : lrq.lrpairs)
    {
      unsigned char left = i[which % 2];
      unsigned char right = i[(which + 1) % 2];
      unsigned int k = atoi(i.c_str() + 2);

      features& left_fs = ec.feature_space[left];
      for (unsigned int lfn = 0; lfn < lrq.orig_size[left]; ++lfn)
      {
        float lfx = left_fs.values[lfn];
        uint64_t lindex = left_fs.indicies[lfn] + ec.ft_offset;
        for (unsigned int n = 1; n <= k; ++n)
        {
          if (!do_dropout || cheesyrbit(lrq.seed))
          {
            uint64_t lwindex = (lindex + ((uint64_t)n << stride_shift));
            weight* lw = &lrq.all->weights[lwindex];

            // perturb away from saddle point at (0, 0)
            if (is_learn && !example_is_test(ec) && *lw == 0)
              *lw = cheesyrand(lwindex);  // not sure if lw needs a weight mask?

            features& right_fs = ec.feature_space[right];
            for (unsigned int rfn = 0; rfn < lrq.orig_size[right]; ++rfn)
            {
              // NB: ec.ft_offset added by base learner
              float rfx = right_fs.values[rfn];
              uint64_t rindex = right_fs.indicies[rfn];
              uint64_t rwindex = (rindex + ((uint64_t)n << stride_shift));

              right_fs.push_back(scale * *lw * lfx * rfx, rwindex);

              if (all.audit || all.hash_inv)
              {
                std::stringstream new_feature_buffer;
                new_feature_buffer << right << '^' << right_fs.space_names[rfn].get()->second << '^' << n;

#ifdef _WIN32
                char* new_space = _strdup("lrq");
                char* new_feature = _strdup(new_feature_buffer.str().c_str());
#else
                char* new_space = strdup("lrq");
                char* new_feature = strdup(new_feature_buffer.str().c_str());
#endif
                right_fs.space_names.push_back(audit_strings_ptr(new audit_strings(new_space, new_feature)));
              }
            }
          }
        }
      }
    }

    if (is_learn)
      base.learn(ec);
    else
      base.predict(ec);

    // Restore example
    if (iter == 0)
    {
      first_prediction = ec.pred.scalar;
      first_loss = ec.loss;
      first_uncertainty = ec.confidence;
    }
    else
    {
      ec.pred.scalar = first_prediction;
      ec.loss = first_loss;
      ec.confidence = first_uncertainty;
    }

    for (string const& i : lrq.lrpairs)
    {
      unsigned char right = i[(which + 1) % 2];
      ec.feature_space[right].truncate_to(lrq.orig_size[right]);
    }
  }
}